

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O0

char * vkt::pipeline::anon_unknown_0::getShortName(VkStencilOp stencilOp)

{
  char *pcStack_10;
  VkStencilOp stencilOp_local;
  
  switch(stencilOp) {
  case VK_STENCIL_OP_KEEP:
    pcStack_10 = "keep";
    break;
  case VK_STENCIL_OP_ZERO:
    pcStack_10 = "zero";
    break;
  case VK_STENCIL_OP_REPLACE:
    pcStack_10 = "repl";
    break;
  case VK_STENCIL_OP_INCREMENT_AND_CLAMP:
    pcStack_10 = "incc";
    break;
  case VK_STENCIL_OP_DECREMENT_AND_CLAMP:
    pcStack_10 = "decc";
    break;
  case VK_STENCIL_OP_INVERT:
    pcStack_10 = "inv";
    break;
  case VK_STENCIL_OP_INCREMENT_AND_WRAP:
    pcStack_10 = "wrap";
    break;
  case VK_STENCIL_OP_DECREMENT_AND_WRAP:
    pcStack_10 = "decw";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getShortName (VkStencilOp stencilOp)
{
	switch (stencilOp)
	{
		case VK_STENCIL_OP_KEEP:					return "keep";
		case VK_STENCIL_OP_ZERO:					return "zero";
		case VK_STENCIL_OP_REPLACE:					return "repl";
		case VK_STENCIL_OP_INCREMENT_AND_CLAMP:		return "incc";
		case VK_STENCIL_OP_DECREMENT_AND_CLAMP:		return "decc";
		case VK_STENCIL_OP_INVERT:					return "inv";
		case VK_STENCIL_OP_INCREMENT_AND_WRAP:		return "wrap";
		case VK_STENCIL_OP_DECREMENT_AND_WRAP:		return "decw";

		default:
			DE_FATAL("Invalid VkStencilOpState value");
	}
	return DE_NULL;
}